

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O2

int __thiscall embree::ParseStream::getInt(ParseStream *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (&local_30,
             &this->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  iVar1 = atoi(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int   getInt  () {
      return atoi(get().c_str());
    }